

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O0

int Eso_ManFindDistOneLitEqual(int *pCube1,int *pCube2,int nLits)

{
  int iVar1;
  int iVar2;
  int local_2c;
  int local_28;
  int iDiff;
  int i;
  int nLits_local;
  int *pCube2_local;
  int *pCube1_local;
  
  local_2c = -1;
  local_28 = 0;
  do {
    if (nLits <= local_28) {
      return local_2c;
    }
    if (pCube1[local_28] != pCube2[local_28]) {
      if (local_2c != -1) {
        return -1;
      }
      iVar1 = Abc_Lit2Var(pCube1[local_28]);
      iVar2 = Abc_Lit2Var(pCube2[local_28]);
      if (iVar1 != iVar2) {
        return -1;
      }
      local_2c = local_28;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

int Eso_ManFindDistOneLitEqual( int * pCube1, int * pCube2, int nLits ) // pCube1 and pCube2 both have nLits
{
    int i, iDiff = -1;
    for ( i = 0; i < nLits; i++ )
        if ( pCube1[i] != pCube2[i] )
        {
            if ( iDiff != -1 )
                return -1;
            if ( Abc_Lit2Var(pCube1[i]) != Abc_Lit2Var(pCube2[i]) )
                return -1;
            iDiff = i;
        }
    return iDiff;
}